

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

uint __thiscall CScript::GetSigOpCount(CScript *this,CScript *scriptSig)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  CScript *pCVar5;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vData;
  const_iterator pc;
  CScript subscript;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = IsPayToScriptHash(this);
  if (bVar3) {
    pc.ptr = (uchar *)scriptSig;
    if (0x1c < (scriptSig->super_CScriptBase)._size) {
      pc.ptr = (uchar *)(scriptSig->super_CScriptBase)._union.indirect_contents.indirect;
    }
    vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      uVar4 = (scriptSig->super_CScriptBase)._size;
      uVar2 = uVar4 - 0x1d;
      if (uVar4 < 0x1d) {
        uVar2 = uVar4;
      }
      pCVar5 = (CScript *)(scriptSig->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar4 < 0x1d) {
        pCVar5 = scriptSig;
      }
      if ((pCVar5->super_CScriptBase)._union.direct + (int)uVar2 <= pc.ptr) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  (&subscript.super_CScriptBase,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_finish);
        uVar4 = GetSigOpCount(&subscript,true);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&subscript.super_CScriptBase);
        goto LAB_00156e0d;
      }
      bVar3 = GetOp(scriptSig,&pc,(opcodetype *)&subscript,&vData);
    } while ((bVar3) && ((int)subscript.super_CScriptBase._union._0_4_ < 0x61));
    uVar4 = 0;
LAB_00156e0d:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return uVar4;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar4 = GetSigOpCount(this,true);
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CScript::GetSigOpCount(const CScript& scriptSig) const
{
    if (!IsPayToScriptHash())
        return GetSigOpCount(true);

    // This is a pay-to-script-hash scriptPubKey;
    // get the last item that the scriptSig
    // pushes onto the stack:
    const_iterator pc = scriptSig.begin();
    std::vector<unsigned char> vData;
    while (pc < scriptSig.end())
    {
        opcodetype opcode;
        if (!scriptSig.GetOp(pc, opcode, vData))
            return 0;
        if (opcode > OP_16)
            return 0;
    }

    /// ... and return its opcount:
    CScript subscript(vData.begin(), vData.end());
    return subscript.GetSigOpCount(true);
}